

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20240722::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__6,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  undefined8 in_R9;
  char local_128 [32];
  undefined8 local_108;
  undefined8 uStack_100;
  char local_f8 [32];
  long local_d8;
  char *pcStack_d0;
  char local_c8 [32];
  long local_a8;
  char *pcStack_a0;
  char local_98 [32];
  long local_78;
  char *pcStack_70;
  long local_68;
  char *pcStack_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  long local_48;
  char *local_40;
  
  local_a8 = absl::lts_20240722::numbers_internal::FastIntToBuffer
                       (*(int *)**(undefined8 **)this,local_98);
  local_a8 = local_a8 - (long)local_98;
  pcStack_a0 = local_98;
  local_d8 = absl::lts_20240722::numbers_internal::FastIntToBuffer
                       (*(int *)(**(long **)this + 4) + -1,local_c8);
  local_d8 = local_d8 - (long)local_c8;
  pcStack_d0 = local_c8;
  local_108 = absl::lts_20240722::numbers_internal::FastIntToBuffer
                        (*(int *)**(undefined8 **)(this + 8),local_f8);
  local_108 = local_108 - (long)local_f8;
  uStack_100 = local_f8;
  local_48 = absl::lts_20240722::numbers_internal::FastIntToBuffer
                       (*(int *)(**(long **)(this + 8) + 4) + -1,local_128);
  local_48 = local_48 - (long)local_128;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_78 = local_a8;
  pcStack_70 = pcStack_a0;
  local_68 = local_d8;
  pcStack_60 = pcStack_d0;
  local_58 = (undefined4)local_108;
  uStack_54 = local_108._4_4_;
  uStack_50 = (undefined4)uStack_100;
  uStack_4c = uStack_100._4_4_;
  local_40 = local_128;
  absl::lts_20240722::substitute_internal::SubstituteAndAppendArray
            (__return_storage_ptr__,0x46,
             "Extension range $0 to $1 overlaps with already-defined range $2 to $3.",&local_78,4,
             in_R9,local_48,local_128);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}